

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O3

stationNameType * __thiscall
sjtu::LRUCache<sjtu::TrainManager::stationNameType>::load
          (LRUCache<sjtu::TrainManager::stationNameType> *this,locType *offset)

{
  Node *pNVar1;
  long lVar2;
  CacheNode *pCVar3;
  CacheNode *pCVar4;
  Node *pNVar5;
  CacheNode *pCVar6;
  CacheNode *pCVar7;
  CacheNode **ppCVar8;
  stationNameType ret;
  undefined8 local_69;
  undefined8 uStack_61;
  undefined8 local_59;
  undefined1 uStack_51;
  undefined7 uStack_50;
  undefined1 uStack_49;
  undefined8 uStack_48;
  value_type local_40;
  pair<sjtu::map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>::iterator,_bool>
  local_30;
  
  this->attempt_count = this->attempt_count + 1;
  pNVar1 = (this->table).nil;
  pNVar5 = pNVar1->left;
  if (pNVar5 != pNVar1) {
    do {
      lVar2 = pNVar5->value->first;
      if (lVar2 == *offset) break;
      pNVar5 = (&pNVar5->left)[lVar2 <= *offset];
    } while (pNVar5 != pNVar1);
  }
  if (pNVar5 == pNVar1) {
    this->miss_count = this->miss_count + 1;
    pCVar6 = (CacheNode *)operator_new(0x58);
    std::istream::seekg(this->file,*offset,0);
    std::istream::read((char *)this->file,(long)&local_69);
    *(ulong *)((pCVar6->value).name + 0x19) = CONCAT17(uStack_49,uStack_50);
    *(undefined8 *)((pCVar6->value).name + 0x21) = uStack_48;
    *(undefined8 *)((pCVar6->value).name + 0x10) = local_59;
    *(ulong *)((pCVar6->value).name + 0x18) = CONCAT71(uStack_50,uStack_51);
    *(undefined8 *)(pCVar6->value).name = local_69;
    *(undefined8 *)((pCVar6->value).name + 8) = uStack_61;
    local_40.first = *offset;
    pCVar6->offset = local_40.first;
    pCVar6->is_dirty_page = false;
    pCVar6->prec = (CacheNode *)0x0;
    pCVar6->succ = (CacheNode *)0x0;
    pCVar6->bel = this;
    local_40.second = pCVar6;
    map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>::
    insert(&local_30,&this->table,&local_40);
    if (this->block_lim == (this->table).tot) {
      pCVar7 = this->tail;
      pCVar3 = pCVar7->prec;
      this->tail = pCVar3;
      ppCVar8 = &pCVar3->succ;
      if (pCVar3 == (CacheNode *)0x0) {
        ppCVar8 = &this->head;
      }
      *ppCVar8 = (CacheNode *)0x0;
      CacheNode::~CacheNode(pCVar7);
      operator_delete(pCVar7,0x58);
    }
    pCVar7 = this->head;
    if (pCVar7 == (CacheNode *)0x0) {
      this->tail = pCVar6;
      goto LAB_001187c3;
    }
  }
  else {
    pCVar6 = pNVar5->value->second;
    pCVar7 = this->head;
    if (pCVar6 == pCVar7) {
      return &pCVar6->value;
    }
    pCVar3 = pCVar6->prec;
    pCVar4 = pCVar6->succ;
    pCVar3->succ = pCVar4;
    ppCVar8 = &pCVar4->prec;
    if (pCVar4 == (CacheNode *)0x0) {
      ppCVar8 = &this->tail;
    }
    *ppCVar8 = pCVar3;
    pCVar6->prec = (CacheNode *)0x0;
  }
  pCVar6->succ = pCVar7;
  pCVar7->prec = pCVar6;
LAB_001187c3:
  this->head = pCVar6;
  return &pCVar6->value;
}

Assistant:

valueType *load(const locType &offset)
		{
			++ attempt_count;
			typename map<locType , CacheNode*>::iterator it = table.find(offset);
			CacheNode *node;
			if (it == table.end())
			{
				++ miss_count;
				node = new CacheNode (f_read(offset) , offset , this);
				if (block_lim == table.size())
				{
					CacheNode *tmp = tail;
					if (tail = tail -> prec) tail -> succ = nullptr;
					else  head = nullptr;
					delete tmp;
				}
				if (head == nullptr) head = tail = node;
				else (node -> succ = head) -> prec = node , head = node;
			}
			else
			{
				node = it -> second;
				if (node != head)
				{
					node -> prec -> succ = node -> succ;
					if (node -> succ) node -> succ -> prec = node -> prec;
					else tail = node -> prec;
					node -> prec = nullptr , (node -> succ = head) -> prec = node , head = node;
				}
			}
			return &(node -> value);
		}